

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclUnmarkCriticalNodeWindow(SC_Man *p,Vec_Int_t *vPath)

{
  Abc_Ntk_t *pNtk;
  int i_00;
  Abc_Obj_t *pAVar1;
  int i;
  int i_01;
  
  for (i_01 = 0; i_01 < vPath->nSize; i_01 = i_01 + 1) {
    pNtk = p->pNtk;
    i_00 = Vec_IntEntry(vPath,i_01);
    pAVar1 = Abc_NtkObj(pNtk,i_00);
    if (pAVar1 != (Abc_Obj_t *)0x0) {
      pAVar1->field_0x14 = pAVar1->field_0x14 & 0xef;
    }
  }
  return;
}

Assistant:

void Abc_SclUnmarkCriticalNodeWindow( SC_Man * p, Vec_Int_t * vPath )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkForEachObjVec( vPath, p->pNtk, pObj, i )
        pObj->fMarkA = 0;
}